

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_2_list_infix_expr(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children2(&G->data,PVIP_NODE_Z,G->val[-2],G->val[-1]);
  G->ss = pPVar1;
  G->val[-2] = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_2_list_infix_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define a G->val[-2]
  yyprintf((stderr, "do yy_2_list_infix_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
            yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_Z, a, b);\n\
            a=yy;\n\
        }\n"));
  
            yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_Z, a, b);
            a=yy;
        ;
#undef b
#undef a
}